

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread_queue.c
# Opt level: O1

int pthread_queue_dequeue(pthread_queue_t *queue,void *buf,uint32_t timeout)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  int iVar2;
  uint uVar3;
  timespec *__abstime;
  timespec ts;
  timespec local_48;
  void *local_38;
  
  __abstime = &local_48;
  if (queue == (pthread_queue_t *)0x0) {
    csp_print_func("csp not initialized\n");
    iVar2 = -1;
  }
  else {
    if (timeout == 0xffffffff) {
      __abstime = (timespec *)0x0;
    }
    else {
      iVar2 = clock_gettime(1,&local_48);
      if (-1 < iVar2) {
        local_48.tv_sec = (ulong)timeout / 1000 + local_48.tv_sec;
        local_48.tv_nsec = (ulong)((timeout % 1000) * 1000000) + local_48.tv_nsec;
        if (999999999 < local_48.tv_nsec) {
          local_48.tv_sec = local_48.tv_sec + 1;
        }
        local_48.tv_nsec = local_48.tv_nsec % 1000000000;
      }
      if (iVar2 != 0) {
        return -1;
      }
    }
    __mutex = &queue->mutex;
    local_38 = buf;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    do {
      iVar1 = queue->items;
      if (iVar1 != 0) {
        iVar2 = 0;
        goto LAB_0010bd0f;
      }
      if (__abstime == (timespec *)0x0) {
        uVar3 = pthread_cond_wait((pthread_cond_t *)&queue->cond_empty,(pthread_mutex_t *)__mutex);
      }
      else {
        uVar3 = pthread_cond_timedwait
                          ((pthread_cond_t *)&queue->cond_empty,(pthread_mutex_t *)__mutex,__abstime
                          );
      }
    } while ((uVar3 & 0xfffffffb) == 0);
    iVar2 = -1;
LAB_0010bd0f:
    if (iVar1 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    }
    else {
      memcpy(local_38,(void *)((long)queue->out * (long)queue->item_size + (long)queue->buffer),
             (long)queue->item_size);
      queue->items = queue->items + -1;
      queue->out = (queue->out + 1) % queue->size;
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      pthread_cond_broadcast((pthread_cond_t *)&queue->cond_full);
    }
  }
  return iVar2;
}

Assistant:

int pthread_queue_dequeue(pthread_queue_t * queue, void * buf, uint32_t timeout) {

	int ret;
	struct timespec ts;
	struct timespec * pts;

	if(!queue){
		csp_print("csp not initialized\n");
		return PTHREAD_QUEUE_ERROR;
	}

	/* Calculate timeout */
	if (timeout != CSP_MAX_TIMEOUT) {
		if (get_deadline(&ts, timeout) != 0) {
			return PTHREAD_QUEUE_ERROR;
		}
		pts = &ts;
	} else {
		pts = NULL;
	}

	/* Get queue lock */
	pthread_mutex_lock(&(queue->mutex));

	ret = wait_item_available(queue, pts);
	if (ret == PTHREAD_QUEUE_OK) {
		/* Coby object to output buffer */
		memcpy(buf, (char *)queue->buffer + (queue->out * queue->item_size), queue->item_size);
		queue->items--;
		queue->out = (queue->out + 1) % queue->size;
	}

	pthread_mutex_unlock(&(queue->mutex));

	if (ret == PTHREAD_QUEUE_OK) {
		/* Nofify blocked threads */
		pthread_cond_broadcast(&(queue->cond_full));
	}

	return ret;
}